

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O2

void secp256k1_sha256_initialize_tagged(secp256k1_sha256 *hash,uchar *tag,size_t taglen)

{
  uchar buf [32];
  
  secp256k1_sha256_initialize(hash);
  secp256k1_sha256_write(hash,tag,taglen);
  secp256k1_sha256_finalize(hash,buf);
  secp256k1_sha256_initialize(hash);
  secp256k1_sha256_write(hash,buf,0x20);
  secp256k1_sha256_write(hash,buf,0x20);
  return;
}

Assistant:

static void secp256k1_sha256_initialize_tagged(secp256k1_sha256 *hash, const unsigned char *tag, size_t taglen) {
    unsigned char buf[32];
    secp256k1_sha256_initialize(hash);
    secp256k1_sha256_write(hash, tag, taglen);
    secp256k1_sha256_finalize(hash, buf);

    secp256k1_sha256_initialize(hash);
    secp256k1_sha256_write(hash, buf, 32);
    secp256k1_sha256_write(hash, buf, 32);
}